

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O3

void __thiscall
nuraft::asio_rpc_listener::remove_session(asio_rpc_listener *this,ptr<rpc_session> *session)

{
  shared_ptr<nuraft::rpc_session> *psVar1;
  int iVar2;
  iterator __position;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->session_lock_);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  __position._M_current =
       (this->active_sessions_).
       super__Vector_base<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->active_sessions_).
           super__Vector_base<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current != psVar1) {
    do {
      if (((__position._M_current)->
          super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
          (session->super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>)._M_ptr) {
        std::
        vector<std::shared_ptr<nuraft::rpc_session>,_std::allocator<std::shared_ptr<nuraft::rpc_session>_>_>
        ::_M_erase(&this->active_sessions_,__position);
        break;
      }
      __position._M_current = __position._M_current + 1;
    } while (__position._M_current != psVar1);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->session_lock_);
  return;
}

Assistant:

void remove_session(const ptr<rpc_session>& session) {
        auto_lock(session_lock_);

        for (auto it = active_sessions_.begin();
             it != active_sessions_.end(); ++it) {
            if (*it == session) {
                active_sessions_.erase(it);
                break;
            }
        }
    }